

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O2

int __thiscall FormatTypeDSK::FillTrack(FormatTypeDSK *this,uchar *track_buffer,int side,int track)

{
  ushort uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int index;
  ulong uVar4;
  int iVar5;
  Track **ppTVar6;
  uint k;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  CRC crc;
  
  uVar3 = 0;
  iVar5 = 0x50;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    uVar3 = IDisk::AddByteToTrack(track_buffer,uVar3,'N',8,'\0');
  }
  iVar5 = 0xc;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    uVar3 = IDisk::AddByteToTrack(track_buffer,uVar3,'\0',8,'\0');
  }
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,uVar3,0xc2);
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,uVar3,0xc2);
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,uVar3,0xc2);
  uVar3 = IDisk::AddByteToTrack(track_buffer,uVar3,0xfc,8,'\0');
  iVar5 = 0x32;
  while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
    uVar3 = IDisk::AddByteToTrack(track_buffer,uVar3,'N',8,'\0');
  }
  ppTVar6 = &this->side_[side].tracks;
  for (uVar4 = 0; uVar4 < (*ppTVar6)[track].nb_sector; uVar4 = uVar4 + 1) {
    CRC::CRC(&crc);
    CRC::Reset(&crc);
    iVar5 = 0xc;
    while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
      uVar3 = IDisk::AddByteWithCrc(track_buffer,uVar3,'\0',&crc,false);
    }
    CRC::Reset(&crc);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,uVar3,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xfe,&crc,false);
    iVar5 = IDisk::AddByteWithCrc
                      (track_buffer,iVar5,(*ppTVar6)[track].sectors[uVar4].track,&crc,false);
    iVar5 = IDisk::AddByteWithCrc
                      (track_buffer,iVar5,(*ppTVar6)[track].sectors[uVar4].side,&crc,false);
    iVar5 = IDisk::AddByteWithCrc
                      (track_buffer,iVar5,(*ppTVar6)[track].sectors[uVar4].sector_id,&crc,false);
    iVar5 = IDisk::AddByteWithCrc
                      (track_buffer,iVar5,(*ppTVar6)[track].sectors[uVar4].sector_size,&crc,false);
    uVar2 = crc.computed_crc_;
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,(uchar)(crc.computed_crc_ >> 8),&crc,false);
    index = IDisk::AddByteWithCrc(track_buffer,iVar5,(uchar)uVar2,&crc,false);
    CRC::Reset(&crc);
    iVar5 = 0x16;
    while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
      index = IDisk::AddByteWithCrc(track_buffer,index,'N',&crc,false);
    }
    iVar5 = 0xc;
    while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
      index = IDisk::AddByteWithCrc(track_buffer,index,'\0',&crc,false);
    }
    CRC::Reset(&crc);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,index,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc(track_buffer,iVar5,0xa1,&crc,true);
    iVar5 = IDisk::AddByteWithCrc
                      (track_buffer,iVar5,
                       (((*ppTVar6)[track].sectors[uVar4].fdc_status_2 & 0x40) == 0) * '\x03' + 0xf8
                       ,&crc,false);
    uVar1 = (*ppTVar6)[track].sectors[uVar4].actual_size;
    for (uVar8 = 0; uVar2 = crc.computed_crc_, uVar1 != uVar8; uVar8 = uVar8 + 1) {
      iVar5 = IDisk::AddByteWithCrc
                        (track_buffer,iVar5,(*ppTVar6)[track].sectors[uVar4].data[uVar8],&crc,false)
      ;
    }
    iVar5 = IDisk::AddByteWithoutCrc(track_buffer,iVar5,(uchar)(crc.computed_crc_ >> 8),false);
    uVar3 = IDisk::AddByteWithoutCrc(track_buffer,iVar5,(uchar)uVar2,false);
    CRC::Reset(&crc);
    for (uVar7 = 0; uVar7 < (*ppTVar6)[track].gap3; uVar7 = uVar7 + 1) {
      uVar3 = IDisk::AddByteWithoutCrc(track_buffer,uVar3,(*ppTVar6)[track].gap3_filter,false);
    }
    CRC::~CRC(&crc);
  }
  while ((int)uVar3 < 0x4000) {
    iVar5 = IDisk::AddByteWithoutCrc(track_buffer,uVar3,'N',false);
    uVar3 = iVar5 + 1;
  }
  return uVar3;
}

Assistant:

int FormatTypeDSK::FillTrack(unsigned char* track_buffer, int side, int track)
{
   int j, N;

   int load_disk_index = 0;

   // GAP 4a : 80 byte with value 0x4E
   for (j = 0; j < 80; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Sync : 12 byte with value 0x00
   for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x00);

   // IAM : 3 byte with 0xC2, then one byte with 0xFC
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   unsigned int last_valid_data = 0;

   // Then, each sectors :
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      crc.Reset();
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].track,
                                            crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].side,
                                            crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].sector_id,
                                            crc);
      // - N (identification secteur 'N' = 1 byte)
      N = side_[side].tracks[track].sectors[s].sector_size;
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, N, crc);

      // - Crc (2 bytes) - TODO ???
      //if (NsizeOfTrack_L == sizeOfTrack_L)
      //   if (false)
      {
         unsigned short computed_crc = crc.GetCRC();
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);
      }

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);

      if ((side_[side].tracks[track].sectors[s].fdc_status_2 & 0x40) == 0x40)
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_ERASED, crc);
      else
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < size_of_track; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index,
                                               side_[side].tracks[track].sectors[s].data[k], crc);
      }

      // - Crc (2 bytes) - If needed....
      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      crc.Reset();

      // - GAP #3 (x bytes)
      for (j = 0; j < side_[side].tracks[track].gap3; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, side_[side].tracks[track].gap3_filter);
      }
   }

   // End of track : GAP 4B until DEFAULT_TRACK_SIZE bytes.
   for (; load_disk_index < DEFAULT_TRACK_SIZE; load_disk_index++)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   return load_disk_index;
}